

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::Bytecode::Bytecode(Bytecode *this,Op op,string_view str,uint flags)

{
  uint flags_local;
  Op op_local;
  Bytecode *this_local;
  string_view str_local;
  
  str_local.data_ = (const_pointer)str.size_;
  this_local = (Bytecode *)str.data_;
  this->op = op;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xc0000000;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0x3fffffff | flags << 0x1e;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&this->value,(nullptr_t)0x0);
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&this->str,(basic_string_view *)&this_local);
  return;
}

Assistant:

explicit Bytecode(Op op, nonstd::string_view str, unsigned int flags) : op(op), args(0), flags(flags), str(str) {}